

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O3

FT_Error FT_Outline_Render(FT_Library library,FT_Outline *outline,FT_Raster_Params *params)

{
  short sVar1;
  FT_Vector *pFVar2;
  long lVar3;
  long lVar4;
  FT_Renderer_conflict pFVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  FT_ListRec *pFVar11;
  long lVar12;
  long lVar13;
  FT_Vector *pFVar14;
  FT_ListNode pFVar15;
  
  if (library == (FT_Library)0x0) {
    iVar8 = 0x21;
  }
  else {
    iVar8 = 0x14;
    if (outline != (FT_Outline *)0x0) {
      if (params == (FT_Raster_Params *)0x0) {
        iVar8 = 6;
      }
      else {
        sVar1 = outline->n_points;
        if ((long)sVar1 == 0) {
          lVar9 = 0;
          lVar12 = 0;
          lVar10 = 0;
          lVar13 = 0;
        }
        else {
          pFVar2 = outline->points;
          lVar12 = pFVar2->x;
          lVar9 = pFVar2->y;
          lVar10 = lVar9;
          lVar13 = lVar12;
          if (1 < sVar1) {
            pFVar14 = pFVar2 + 1;
            do {
              lVar3 = pFVar14->x;
              if (lVar3 < lVar12) {
                lVar12 = lVar3;
              }
              lVar4 = pFVar14->y;
              if (lVar13 < lVar3) {
                lVar13 = lVar3;
              }
              if (lVar4 < lVar9) {
                lVar9 = lVar4;
              }
              if (lVar10 < lVar4) {
                lVar10 = lVar4;
              }
              pFVar14 = pFVar14 + 1;
            } while (pFVar14 < pFVar2 + sVar1);
          }
        }
        if ((((-0x1000001 < lVar12) && (-0x1000001 < lVar9)) && (lVar13 < 0x1000001)) &&
           (lVar10 < 0x1000001)) {
          pFVar15 = (library->renderers).head;
          pFVar5 = library->cur_renderer;
          params->source = outline;
          if ((params->flags & 6U) == 2) {
            (params->clip_box).xMin = lVar12 >> 6;
            (params->clip_box).yMin = lVar9 >> 6;
            (params->clip_box).xMax = lVar13 + 0x3f >> 6;
            (params->clip_box).yMax = lVar10 + 0x3f >> 6;
          }
          if (pFVar5 == (FT_Renderer_conflict)0x0) {
            iVar8 = 0x13;
          }
          else {
            iVar7 = (*pFVar5->raster_render)(pFVar5->raster,params);
            iVar8 = 0;
            if (iVar7 != 0) {
              iVar8 = iVar7;
              while ((char)iVar8 == '\x13') {
                pFVar11 = (FT_ListRec *)&pFVar15->next;
                if (pFVar15 == (FT_ListNode)0x0) {
                  pFVar11 = &library->renderers;
                }
                pFVar15 = pFVar11->head;
                while( true ) {
                  if (pFVar15 == (FT_ListNode)0x0) {
                    return iVar8;
                  }
                  pvVar6 = pFVar15->data;
                  if (*(int *)((long)pvVar6 + 0x20) == 0x6f75746c) break;
                  pFVar15 = pFVar15->next;
                }
                iVar8 = (**(code **)((long)pvVar6 + 0x70))
                                  (*(undefined8 *)((long)pvVar6 + 0x68),params);
                if (iVar8 == 0) {
                  return 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar8;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Render( FT_Library         library,
                     FT_Outline*        outline,
                     FT_Raster_Params*  params )
  {
    FT_Error     error;
    FT_Renderer  renderer;
    FT_ListNode  node;
    FT_BBox      cbox;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !params )
      return FT_THROW( Invalid_Argument );

    FT_Outline_Get_CBox( outline, &cbox );
    if ( cbox.xMin < -0x1000000L || cbox.yMin < -0x1000000L ||
         cbox.xMax >  0x1000000L || cbox.yMax >  0x1000000L )
      return FT_THROW( Invalid_Outline );

    renderer = library->cur_renderer;
    node     = library->renderers.head;

    params->source = (void*)outline;

    /* preset clip_box for direct mode */
    if ( params->flags & FT_RASTER_FLAG_DIRECT    &&
         !( params->flags & FT_RASTER_FLAG_CLIP ) )
    {
      params->clip_box.xMin = cbox.xMin >> 6;
      params->clip_box.yMin = cbox.yMin >> 6;
      params->clip_box.xMax = ( cbox.xMax + 63 ) >> 6;
      params->clip_box.yMax = ( cbox.yMax + 63 ) >> 6;
    }

    error = FT_ERR( Cannot_Render_Glyph );
    while ( renderer )
    {
      error = renderer->raster_render( renderer->raster, params );
      if ( !error || FT_ERR_NEQ( error, Cannot_Render_Glyph ) )
        break;

      /* FT_Err_Cannot_Render_Glyph is returned if the render mode   */
      /* is unsupported by the current renderer for this glyph image */
      /* format                                                      */

      /* now, look for another renderer that supports the same */
      /* format                                                */
      renderer = FT_Lookup_Renderer( library, FT_GLYPH_FORMAT_OUTLINE,
                                     &node );
    }

    return error;
  }